

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509name.c
# Opt level: O0

int X509_NAME_add_entry_by_NID
              (X509_NAME *name,int nid,int type,uchar *bytes,int len,int loc,int set)

{
  X509_NAME_ENTRY *ne_00;
  int ret;
  X509_NAME_ENTRY *ne;
  undefined4 local_4;
  
  ne_00 = X509_NAME_ENTRY_create_by_NID((X509_NAME_ENTRY **)0x0,nid,type,bytes,len);
  if (ne_00 == (X509_NAME_ENTRY *)0x0) {
    local_4 = 0;
  }
  else {
    local_4 = X509_NAME_add_entry(name,ne_00,loc,set);
    X509_NAME_ENTRY_free(ne_00);
  }
  return local_4;
}

Assistant:

int X509_NAME_add_entry_by_NID(X509_NAME *name, int nid, int type,
                               const unsigned char *bytes, int len, int loc,
                               int set)
{
    X509_NAME_ENTRY *ne;
    int ret;
    ne = X509_NAME_ENTRY_create_by_NID(NULL, nid, type, bytes, len);
    if (!ne)
        return 0;
    ret = X509_NAME_add_entry(name, ne, loc, set);
    X509_NAME_ENTRY_free(ne);
    return ret;
}